

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

GLchar * __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::repetitionsToStr
          (LineContinuationTest *this,REPETITIONS repetitions)

{
  char *local_20;
  GLchar *result;
  REPETITIONS repetitions_local;
  LineContinuationTest *this_local;
  
  if (repetitions == ONCE) {
    local_20 = "single";
  }
  else {
    local_20 = "multiple";
  }
  return local_20;
}

Assistant:

const GLchar* LineContinuationTest::repetitionsToStr(REPETITIONS repetitions) const
{
	const GLchar* result = 0;

	if (ONCE == repetitions)
	{
		result = "single";
	}
	else
	{
		result = "multiple";
	}

	return result;
}